

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O2

void __thiscall GGSock::FileServer::FileServer(FileServer *this)

{
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> this_00;
  
  this_00._M_head_impl = (Impl *)operator_new(0x128);
  memset(this_00._M_head_impl,0,0x128);
  Impl::Impl(this_00._M_head_impl);
  (this->m_impl)._M_t.
  super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>.
  _M_t.
  super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
  .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl = this_00._M_head_impl;
  return;
}

Assistant:

FileServer::FileServer() : m_impl(new Impl()) {
}